

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

int __thiscall
yactfr::internal::PseudoVarType::clone
          (PseudoVarType *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined1 local_40 [32];
  undefined1 local_20 [16];
  PseudoVarType *this_local;
  
  local_20._8_8_ = __fn;
  this_local = this;
  _clonePseudoOpts((PseudoNamedDts *)(local_40 + 8),(PseudoVarType *)__fn);
  WithAttrsMixin::attrs((WithAttrsMixin *)(__fn + 0x30));
  tryCloneAttrs((MapItem *)local_40);
  PseudoDt::loc((PseudoDt *)__fn);
  std::
  make_unique<yactfr::internal::PseudoVarType,boost::optional<yactfr::internal::PseudoDataLoc>const&,std::vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>,std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,std::default_delete<yactfr::internal::PseudoNamedDt>>>>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>,yactfr::TextLocation_const&>
            ((optional<yactfr::internal::PseudoDataLoc> *)local_20,
             (vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
              *)(__fn + 0x50),
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             (local_40 + 8),(TextLocation *)local_40);
  std::unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>::
  unique_ptr<yactfr::internal::PseudoVarType,std::default_delete<yactfr::internal::PseudoVarType>,void>
            ((unique_ptr<yactfr::internal::PseudoDt,std::default_delete<yactfr::internal::PseudoDt>>
              *)this,(unique_ptr<yactfr::internal::PseudoVarType,_std::default_delete<yactfr::internal::PseudoVarType>_>
                      *)local_20);
  std::
  unique_ptr<yactfr::internal::PseudoVarType,_std::default_delete<yactfr::internal::PseudoVarType>_>
  ::~unique_ptr((unique_ptr<yactfr::internal::PseudoVarType,_std::default_delete<yactfr::internal::PseudoVarType>_>
                 *)local_20);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_40);
  std::
  vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
  ::~vector((vector<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>,_std::allocator<std::unique_ptr<yactfr::internal::PseudoNamedDt,_std::default_delete<yactfr::internal::PseudoNamedDt>_>_>_>
             *)(local_40 + 8));
  return (int)this;
}

Assistant:

PseudoDt::Up PseudoVarType::clone() const
{
   return std::make_unique<PseudoVarType>(_pseudoSelLoc, this->_clonePseudoOpts(),
                                          tryCloneAttrs(this->attrs()), this->loc());
}